

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O0

int test_all_device_options
              (TEST_PROTOCOL_TYPE protocol_type,IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client)

{
  _Bool _Var1;
  IOTHUB_CLIENT_RESULT IVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  _Bool batching;
  LOGGER_LOG p_Stack_d0;
  uint min_poll_time;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  size_t send_timeout;
  double remote_idle_timeout;
  size_t c2d_side_keep_alive;
  size_t server_side_keep_alive;
  size_t cbs_refresh;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  undefined4 local_60;
  undefined4 uStack_5c;
  _Bool url_encode;
  int connection_timeout;
  int keep_alive;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  tickcounter_ms_t msg_timeout;
  size_t sas_token_refresh;
  size_t refresh_sas_token;
  IOTHUB_DEVICE_CLIENT_LL_HANDLE pIStack_18;
  int result;
  IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client_local;
  TEST_PROTOCOL_TYPE protocol_type_local;
  
  refresh_sas_token._4_4_ = 0;
  sas_token_refresh = 0x708;
  msg_timeout = 0x708;
  l = (LOGGER_LOG)0x78;
  pIStack_18 = device_client;
  device_client_local._4_4_ = protocol_type;
  IVar2 = IoTHubDeviceClient_LL_SetOption
                    (device_client,OPTION_SAS_TOKEN_LIFETIME,&sas_token_refresh);
  _Var1 = check_iothub_result(IVar2);
  if (!_Var1) {
    l_1 = xlogging_get_log_function();
    if (l_1 != (LOGGER_LOG)0x0) {
      (*l_1)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
             ,"test_all_device_options",0x187,1,"Failure setting option OPTION_SAS_TOKEN_LIFETIME");
    }
    refresh_sas_token._4_4_ = refresh_sas_token._4_4_ + 1;
  }
  IVar2 = IoTHubDeviceClient_LL_SetOption(pIStack_18,OPTION_SAS_TOKEN_REFRESH_TIME,&msg_timeout);
  _Var1 = check_iothub_result(IVar2);
  if (!_Var1) {
    l_2 = xlogging_get_log_function();
    if (l_2 != (LOGGER_LOG)0x0) {
      (*l_2)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
             ,"test_all_device_options",0x18c,1,
             "Failure setting option OPTION_SAS_TOKEN_REFRESH_TIME");
    }
    refresh_sas_token._4_4_ = refresh_sas_token._4_4_ + 1;
  }
  IVar2 = IoTHubDeviceClient_LL_SetOption(pIStack_18,OPTION_MESSAGE_TIMEOUT,&l);
  _Var1 = check_iothub_result(IVar2);
  if (!_Var1) {
    l_3 = xlogging_get_log_function();
    if (l_3 != (LOGGER_LOG)0x0) {
      (*l_3)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
             ,"test_all_device_options",0x191,1,"Failure setting option OPTION_MESSAGE_TIMEOUT");
    }
    refresh_sas_token._4_4_ = refresh_sas_token._4_4_ + 1;
  }
  IVar2 = IoTHubDeviceClient_LL_SetOption(pIStack_18,OPTION_PRODUCT_INFO,"custom_product_info");
  _Var1 = check_iothub_result(IVar2);
  if (!_Var1) {
    _connection_timeout = xlogging_get_log_function();
    if (_connection_timeout != (LOGGER_LOG)0x0) {
      (*_connection_timeout)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                 ,"test_all_device_options",0x196,1,"Failure setting option OPTION_PRODUCT_INFO");
    }
    refresh_sas_token._4_4_ = refresh_sas_token._4_4_ + 1;
  }
  if ((device_client_local._4_4_ == TEST_MQTT) ||
     (device_client_local._4_4_ == TEST_MQTT_WEBSOCKETS)) {
    uStack_5c = 300;
    local_60 = 0x1f;
    l_4._7_1_ = 1;
    IVar2 = IoTHubDeviceClient_LL_SetOption
                      (pIStack_18,OPTION_AUTO_URL_ENCODE_DECODE,(void *)((long)&l_4 + 7));
    _Var1 = check_iothub_result(IVar2);
    if (!_Var1) {
      l_5 = xlogging_get_log_function();
      if (l_5 != (LOGGER_LOG)0x0) {
        (*l_5)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
               ,"test_all_device_options",0x1a3,1,
               "Failure setting option OPTION_AUTO_URL_ENCODE_DECODE");
      }
      refresh_sas_token._4_4_ = refresh_sas_token._4_4_ + 1;
    }
    IVar2 = IoTHubDeviceClient_LL_SetOption(pIStack_18,OPTION_KEEP_ALIVE,&stack0xffffffffffffffa4);
    _Var1 = check_iothub_result(IVar2);
    if (!_Var1) {
      l_6 = xlogging_get_log_function();
      if (l_6 != (LOGGER_LOG)0x0) {
        (*l_6)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
               ,"test_all_device_options",0x1a8,1,"Failure setting option OPTION_KEEP_ALIVE");
      }
      refresh_sas_token._4_4_ = refresh_sas_token._4_4_ + 1;
    }
    IVar2 = IoTHubDeviceClient_LL_SetOption(pIStack_18,OPTION_CONNECTION_TIMEOUT,&local_60);
    _Var1 = check_iothub_result(IVar2);
    if (!_Var1) {
      cbs_refresh = (size_t)xlogging_get_log_function();
      if ((LOGGER_LOG)cbs_refresh != (LOGGER_LOG)0x0) {
        (*(code *)cbs_refresh)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                   ,"test_all_device_options",0x1ad,1,
                   "Failure setting option OPTION_CONNECTION_TIMEOUT");
      }
      refresh_sas_token._4_4_ = refresh_sas_token._4_4_ + 1;
    }
  }
  else if ((device_client_local._4_4_ == TEST_AMQP) ||
          (device_client_local._4_4_ == TEST_AMQP_WEBSOCKETS)) {
    server_side_keep_alive = 0x23;
    c2d_side_keep_alive = 0xf1;
    remote_idle_timeout = 1.1906982064774e-321;
    send_timeout = 0x3fb47ae147ae147b;
    l_7 = (LOGGER_LOG)0x12d;
    IVar2 = IoTHubDeviceClient_LL_SetOption
                      (pIStack_18,OPTION_CBS_REQUEST_TIMEOUT,&server_side_keep_alive);
    _Var1 = check_iothub_result(IVar2);
    if (!_Var1) {
      l_8 = xlogging_get_log_function();
      if (l_8 != (LOGGER_LOG)0x0) {
        (*l_8)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
               ,"test_all_device_options",0x1bc,1,
               "Failure setting option OPTION_CBS_REQUEST_TIMEOUT");
      }
      refresh_sas_token._4_4_ = refresh_sas_token._4_4_ + 1;
    }
    IVar2 = IoTHubDeviceClient_LL_SetOption
                      (pIStack_18,OPTION_SERVICE_SIDE_KEEP_ALIVE_FREQ_SECS,&c2d_side_keep_alive);
    _Var1 = check_iothub_result(IVar2);
    if (!_Var1) {
      l_9 = xlogging_get_log_function();
      if (l_9 != (LOGGER_LOG)0x0) {
        (*l_9)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
               ,"test_all_device_options",0x1c1,1,
               "Failure setting option OPTION_SERVICE_SIDE_KEEP_ALIVE_FREQ_SECS");
      }
      refresh_sas_token._4_4_ = refresh_sas_token._4_4_ + 1;
    }
    IVar2 = IoTHubDeviceClient_LL_SetOption
                      (pIStack_18,OPTION_C2D_KEEP_ALIVE_FREQ_SECS,&remote_idle_timeout);
    _Var1 = check_iothub_result(IVar2);
    if (!_Var1) {
      l_10 = xlogging_get_log_function();
      if (l_10 != (LOGGER_LOG)0x0) {
        (*l_10)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                ,"test_all_device_options",0x1c6,1,
                "Failure setting option OPTION_C2D_KEEP_ALIVE_FREQ_SECS");
      }
      refresh_sas_token._4_4_ = refresh_sas_token._4_4_ + 1;
    }
    IVar2 = IoTHubDeviceClient_LL_SetOption
                      (pIStack_18,OPTION_REMOTE_IDLE_TIMEOUT_RATIO,&send_timeout);
    _Var1 = check_iothub_result(IVar2);
    if (!_Var1) {
      l_11 = xlogging_get_log_function();
      if (l_11 != (LOGGER_LOG)0x0) {
        (*l_11)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                ,"test_all_device_options",0x1cb,1,
                "Failure setting option OPTION_REMOTE_IDLE_TIMEOUT_RATIO");
      }
      refresh_sas_token._4_4_ = refresh_sas_token._4_4_ + 1;
    }
    IVar2 = IoTHubDeviceClient_LL_SetOption(pIStack_18,OPTION_EVENT_SEND_TIMEOUT_SECS,&l_7);
    _Var1 = check_iothub_result(IVar2);
    if (!_Var1) {
      p_Stack_d0 = xlogging_get_log_function();
      if (p_Stack_d0 != (LOGGER_LOG)0x0) {
        (*p_Stack_d0)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                      ,"test_all_device_options",0x1d0,1,
                      "Failure setting option OPTION_EVENT_SEND_TIMEOUT_SECS");
      }
      refresh_sas_token._4_4_ = refresh_sas_token._4_4_ + 1;
    }
  }
  else if (device_client_local._4_4_ == TEST_HTTP) {
    l_12._4_4_ = 0xfa;
    l_12._3_1_ = 1;
    IVar2 = IoTHubDeviceClient_LL_SetOption
                      (pIStack_18,OPTION_MIN_POLLING_TIME,(void *)((long)&l_12 + 4));
    _Var1 = check_iothub_result(IVar2);
    if (!_Var1) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"test_all_device_options",0x1da,1,
                  "Failure setting option OPTION_MIN_POLLING_TIME");
      }
      refresh_sas_token._4_4_ = refresh_sas_token._4_4_ + 1;
    }
    IVar2 = IoTHubDeviceClient_LL_SetOption(pIStack_18,OPTION_BATCHING,(void *)((long)&l_12 + 3));
    _Var1 = check_iothub_result(IVar2);
    if (!_Var1) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"test_all_device_options",0x1df,1,"Failure setting option OPTION_BATCHING");
      }
      refresh_sas_token._4_4_ = refresh_sas_token._4_4_ + 1;
    }
  }
  return refresh_sas_token._4_4_;
}

Assistant:

static int test_all_device_options(TEST_PROTOCOL_TYPE protocol_type, IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client)
{
    int result = 0;

    size_t refresh_sas_token = 30 * 60;
    size_t sas_token_refresh = 30 * 60;
    tickcounter_ms_t msg_timeout = 2*60;

    if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_SAS_TOKEN_LIFETIME, &refresh_sas_token)))
    {
        LogError("Failure setting option OPTION_SAS_TOKEN_LIFETIME");
        result++;
    }
    if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_SAS_TOKEN_REFRESH_TIME, &sas_token_refresh)))
    {
        LogError("Failure setting option OPTION_SAS_TOKEN_REFRESH_TIME");
        result++;
    }
    if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_MESSAGE_TIMEOUT, &msg_timeout)))
    {
        LogError("Failure setting option OPTION_MESSAGE_TIMEOUT");
        result++;
    }
    if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_PRODUCT_INFO, "custom_product_info")))
    {
        LogError("Failure setting option OPTION_PRODUCT_INFO");
        result++;
    }
    // Proxy host???

    // MQTT only
    if (protocol_type == TEST_MQTT || protocol_type == TEST_MQTT_WEBSOCKETS)
    {
        int keep_alive = 5 * 60;
        int connection_timeout = 31;
        bool url_encode = true;
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_AUTO_URL_ENCODE_DECODE, &url_encode)))
        {
            LogError("Failure setting option OPTION_AUTO_URL_ENCODE_DECODE");
            result++;
        }
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_KEEP_ALIVE, &keep_alive)))
        {
            LogError("Failure setting option OPTION_KEEP_ALIVE");
            result++;
        }
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_CONNECTION_TIMEOUT, &connection_timeout)))
        {
            LogError("Failure setting option OPTION_CONNECTION_TIMEOUT");
            result++;
        }
    }
    else if (protocol_type == TEST_AMQP || protocol_type == TEST_AMQP_WEBSOCKETS)
    {
        size_t cbs_refresh = 35;
        size_t server_side_keep_alive = 241;
        size_t c2d_side_keep_alive = 241;
        double remote_idle_timeout = .08;
        size_t send_timeout = 301;

        // Amqp only
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_CBS_REQUEST_TIMEOUT, &cbs_refresh)))
        {
            LogError("Failure setting option OPTION_CBS_REQUEST_TIMEOUT");
            result++;
        }
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_SERVICE_SIDE_KEEP_ALIVE_FREQ_SECS, &server_side_keep_alive)))
        {
            LogError("Failure setting option OPTION_SERVICE_SIDE_KEEP_ALIVE_FREQ_SECS");
            result++;
        }
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_C2D_KEEP_ALIVE_FREQ_SECS, &c2d_side_keep_alive)))
        {
            LogError("Failure setting option OPTION_C2D_KEEP_ALIVE_FREQ_SECS");
            result++;
        }
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_REMOTE_IDLE_TIMEOUT_RATIO, &remote_idle_timeout)))
        {
            LogError("Failure setting option OPTION_REMOTE_IDLE_TIMEOUT_RATIO");
            result++;
        }
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_EVENT_SEND_TIMEOUT_SECS, &send_timeout)))
        {
            LogError("Failure setting option OPTION_EVENT_SEND_TIMEOUT_SECS");
            result++;
        }
    }
    else if (protocol_type == TEST_HTTP)
    {
        unsigned int min_poll_time = 5 * 50;
        bool batching = true;
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_MIN_POLLING_TIME, &min_poll_time)))
        {
            LogError("Failure setting option OPTION_MIN_POLLING_TIME");
            result++;
        }
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_BATCHING, &batching)))
        {
            LogError("Failure setting option OPTION_BATCHING");
            result++;
        }
    }
    return result;
}